

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Ast::print(Ast *this,ostream *os)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  AstNode::print(&this->rootNode,os,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Ast::print(std::ostream &os) {
    this->rootNode.print(os, "");
}